

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textmidi.cpp
# Opt level: O0

void checkOptions(Options *opts)

{
  Options *pOVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  allocator local_211;
  string local_210;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  Options *local_10;
  Options *opts_local;
  
  local_10 = opts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"a|abs|absolute=b",&local_31);
  smf::Options::define(opts,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"d|delta=b",&local_69);
  smf::Options::define(pOVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"author=b",&local_91);
  smf::Options::define(pOVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"version=b",&local_b9);
  smf::Options::define(pOVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"example=b",&local_e1);
  smf::Options::define(pOVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"help=b",&local_109);
  smf::Options::define(pOVar1,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  smf::Options::process(local_10,1,0);
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"author",&local_131);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pOVar1 = local_10;
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    poVar4 = std::operator<<(poVar4,"craig@ccrma.stanford.edu, Nov 1999");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"version",&local_159);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"textmidi version 1.0");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"compiled: ");
    poVar4 = std::operator<<(poVar4,"Apr 26 2025");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  pOVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"help",&local_181);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  pOVar1 = local_10;
  if (bVar2) {
    smf::Options::getCommand_abi_cxx11_(&local_1a8,local_10);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    usage(pcVar5);
    std::__cxx11::string::~string((string *)&local_1a8);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,"example",&local_1c9);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  if (bVar2) {
    example();
    exit(0);
  }
  iVar3 = smf::Options::getArgCount(local_10);
  pOVar1 = local_10;
  if (iVar3 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_210,"absolute",&local_211);
    bVar2 = smf::Options::getBoolean(pOVar1,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    if (bVar2) {
      timestyle = 0x61;
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Error: need one input MIDI file.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  smf::Options::getCommand_abi_cxx11_(&local_1f0,local_10);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  usage(pcVar5);
  std::__cxx11::string::~string((string *)&local_1f0);
  exit(1);
}

Assistant:

void checkOptions(Options& opts) {
	opts.define("a|abs|absolute=b");
	opts.define("d|delta=b");
	opts.define("author=b");
	opts.define("version=b");
	opts.define("example=b");
	opts.define("help=b");
	opts.process();

	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
		     << "craig@ccrma.stanford.edu, Nov 1999" << endl;
		exit(0);
	}
	if (opts.getBoolean("version")) {
		cout << "textmidi version 1.0" << endl;
		cout << "compiled: " << __DATE__ << endl;
	}
	if (opts.getBoolean("help")) {
		usage(opts.getCommand().c_str());
		exit(0);
	}
	if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	// can only have one output filename
	if (opts.getArgCount() == 0) {
		cout << "Error: need one input MIDI file." << endl;
		usage(opts.getCommand().c_str());
		exit(1);
	}

	if (opts.getBoolean("absolute")) {
		timestyle = STYLE_TIME_ABSOLUTE;
	}

}